

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_tree.c
# Opt level: O1

ly_bool trop_leaf_is_key(lysp_node *pn,lysp_node_list *ca_last_list)

{
  char *src;
  ly_bool lVar1;
  char in_DL;
  lysp_node_list *list;
  lysp_node_leaf *leaf;
  
  if (((ca_last_list != (lysp_node_list *)0x0) && (src = ca_last_list->key, src != (char *)0x0)) &&
     (*src != '\0')) {
    lVar1 = trg_word_is_present(src,pn->name,in_DL);
    return lVar1;
  }
  return '\0';
}

Assistant:

static ly_bool
trop_leaf_is_key(const struct lysp_node *pn, const struct lysp_node_list *ca_last_list)
{
    const struct lysp_node_leaf *leaf = (const struct lysp_node_leaf *)pn;
    const struct lysp_node_list *list = ca_last_list;

    if (!list) {
        return 0;
    }
    return trg_charptr_has_data(list->key) ?
           trg_word_is_present(list->key, leaf->name, ' ') : 0;
}